

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acftest.c
# Opt level: O0

int main(void)

{
  int N_00;
  int iVar1;
  double *vec;
  double *par;
  double local_25b8;
  double temp [1200];
  FILE *ifp;
  int method;
  double *acf;
  double *inp;
  int M;
  int N;
  int i;
  
  temp[0x4af] = (double)fopen("../data/seriesC.txt","r");
  M = 0;
  if ((FILE *)temp[0x4af] != (FILE *)0x0) {
    while (N_00 = M, iVar1 = feof((FILE *)temp[0x4af]), iVar1 == 0) {
      __isoc99_fscanf(temp[0x4af],"%lf \n",temp + (long)M + -1);
      M = M + 1;
    }
    vec = (double *)malloc((long)M << 3);
    for (M = 0; M < N_00; M = M + 1) {
      vec[M] = temp[(long)M + -1];
    }
    par = (double *)malloc(0x50);
    printf("\n Default Method : acvf \n");
    acvf(vec,N_00,par,10);
    for (M = 0; M < 10; M = M + 1) {
      printf("%g ",par[M]);
    }
    printf("\n");
    printf("\n acvf_opt Method 0 General Method \n");
    acvf_opt(vec,N_00,0,par,10);
    for (M = 0; M < 10; M = M + 1) {
      printf("%g ",par[M]);
    }
    printf("\n");
    printf("\n acvf_opt Method 1 FFT \n");
    acvf_opt(vec,N_00,1,par,10);
    for (M = 0; M < 10; M = M + 1) {
      printf("%g ",par[M]);
    }
    printf("\n \n");
    printf("Autocorrelation \n");
    acvf2acf(par,10);
    for (M = 0; M < 10; M = M + 1) {
      printf("%g ",par[M]);
    }
    printf("\n");
    free(vec);
    free(par);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, M;
	double *inp, *acf;
	int method;

	/*
	acvf and acvf_opt functions will calculate autocovariance from lag 0 to lag M-1
	*/

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesC.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}

	M = 10;
	acf = (double*)malloc(sizeof(double)* M);

	// Default Method

	printf("\n Default Method : acvf \n");

	acvf(inp, N, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	// acvf_opt : Method 0 General Method
	method = 0;
	printf("\n acvf_opt Method 0 General Method \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}

	printf("\n");
	// acvf_opt : Method 1 FFT
	method = 1;
	printf("\n acvf_opt Method 1 FFT \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n \n");

	// Calculate Autocorrelation from already caluclated Covariance function
	printf("Autocorrelation \n");
	acvf2acf(acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	free(inp);
	free(acf);
	return 0;

}